

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O3

N_Vector N_VNewEmpty_Serial(sunindextype length,SUNContext_conflict sunctx)

{
  N_Vector_Ops p_Var1;
  N_Vector p_Var2;
  sunindextype *psVar3;
  
  p_Var2 = (N_Vector)N_VNewEmpty(sunctx);
  p_Var1 = p_Var2->ops;
  p_Var1->nvgetvectorid = N_VGetVectorID_Serial;
  p_Var1->nvclone = N_VClone_Serial;
  p_Var1->nvcloneempty = N_VCloneEmpty_Serial;
  p_Var1->nvdestroy = N_VDestroy_Serial;
  p_Var1->nvspace = N_VSpace_Serial;
  p_Var1->nvgetarraypointer = N_VGetArrayPointer_Serial;
  p_Var1->nvsetarraypointer = N_VSetArrayPointer_Serial;
  p_Var1->nvgetlength = N_VGetLength_Serial;
  p_Var1->nvgetlocallength = N_VGetLength_Serial;
  p_Var1->nvlinearsum = N_VLinearSum_Serial;
  p_Var1->nvconst = N_VConst_Serial;
  p_Var1->nvprod = N_VProd_Serial;
  p_Var1->nvdiv = N_VDiv_Serial;
  p_Var1->nvscale = N_VScale_Serial;
  p_Var1->nvabs = N_VAbs_Serial;
  p_Var1->nvinv = N_VInv_Serial;
  p_Var1->nvaddconst = N_VAddConst_Serial;
  p_Var1->nvdotprod = N_VDotProd_Serial;
  p_Var1->nvmaxnorm = N_VMaxNorm_Serial;
  p_Var1->nvwrmsnormmask = N_VWrmsNormMask_Serial;
  p_Var1->nvwrmsnorm = N_VWrmsNorm_Serial;
  p_Var1->nvmin = N_VMin_Serial;
  p_Var1->nvwl2norm = N_VWL2Norm_Serial;
  p_Var1->nvl1norm = N_VL1Norm_Serial;
  p_Var1->nvcompare = N_VCompare_Serial;
  p_Var1->nvinvtest = N_VInvTest_Serial;
  p_Var1->nvconstrmask = N_VConstrMask_Serial;
  p_Var1->nvminquotient = N_VMinQuotient_Serial;
  p_Var1->nvdotprodlocal = N_VDotProd_Serial;
  p_Var1->nvmaxnormlocal = N_VMaxNorm_Serial;
  p_Var1->nvminlocal = N_VMin_Serial;
  p_Var1->nvl1normlocal = N_VL1Norm_Serial;
  p_Var1->nvinvtestlocal = N_VInvTest_Serial;
  p_Var1->nvconstrmasklocal = N_VConstrMask_Serial;
  p_Var1->nvminquotientlocal = N_VMinQuotient_Serial;
  p_Var1->nvwsqrsumlocal = N_VWSqrSumLocal_Serial;
  p_Var1->nvwsqrsummasklocal = N_VWSqrSumMaskLocal_Serial;
  p_Var1->nvdotprodmultilocal = N_VDotProdMulti_Serial;
  p_Var1->nvbufsize = N_VBufSize_Serial;
  p_Var1->nvbufpack = N_VBufPack_Serial;
  p_Var1->nvbufunpack = N_VBufUnpack_Serial;
  p_Var1->nvprint = N_VPrint_Serial;
  p_Var1->nvprintfile = N_VPrintFile_Serial;
  psVar3 = (sunindextype *)malloc(0x18);
  p_Var2->content = psVar3;
  *psVar3 = length;
  *(undefined4 *)(psVar3 + 1) = 0;
  psVar3[2] = 0;
  return p_Var2;
}

Assistant:

N_Vector N_VNewEmpty_Serial(sunindextype length, SUNContext sunctx)
{
  SUNFunctionBegin(sunctx);
  N_Vector v;
  N_VectorContent_Serial content;

  SUNAssertNull(length >= 0, SUN_ERR_ARG_OUTOFRANGE);

  /* Create an empty vector object */
  v = NULL;
  v = N_VNewEmpty(sunctx);
  SUNCheckLastErrNull();

  /* Attach operations */

  /* constructors, destructors, and utility operations */
  v->ops->nvgetvectorid     = N_VGetVectorID_Serial;
  v->ops->nvclone           = N_VClone_Serial;
  v->ops->nvcloneempty      = N_VCloneEmpty_Serial;
  v->ops->nvdestroy         = N_VDestroy_Serial;
  v->ops->nvspace           = N_VSpace_Serial;
  v->ops->nvgetarraypointer = N_VGetArrayPointer_Serial;
  v->ops->nvsetarraypointer = N_VSetArrayPointer_Serial;
  v->ops->nvgetlength       = N_VGetLength_Serial;
  v->ops->nvgetlocallength  = N_VGetLength_Serial;

  /* standard vector operations */
  v->ops->nvlinearsum    = N_VLinearSum_Serial;
  v->ops->nvconst        = N_VConst_Serial;
  v->ops->nvprod         = N_VProd_Serial;
  v->ops->nvdiv          = N_VDiv_Serial;
  v->ops->nvscale        = N_VScale_Serial;
  v->ops->nvabs          = N_VAbs_Serial;
  v->ops->nvinv          = N_VInv_Serial;
  v->ops->nvaddconst     = N_VAddConst_Serial;
  v->ops->nvdotprod      = N_VDotProd_Serial;
  v->ops->nvmaxnorm      = N_VMaxNorm_Serial;
  v->ops->nvwrmsnormmask = N_VWrmsNormMask_Serial;
  v->ops->nvwrmsnorm     = N_VWrmsNorm_Serial;
  v->ops->nvmin          = N_VMin_Serial;
  v->ops->nvwl2norm      = N_VWL2Norm_Serial;
  v->ops->nvl1norm       = N_VL1Norm_Serial;
  v->ops->nvcompare      = N_VCompare_Serial;
  v->ops->nvinvtest      = N_VInvTest_Serial;
  v->ops->nvconstrmask   = N_VConstrMask_Serial;
  v->ops->nvminquotient  = N_VMinQuotient_Serial;

  /* fused and vector array operations are disabled (NULL) by default */

  /* local reduction operations */
  v->ops->nvdotprodlocal     = N_VDotProd_Serial;
  v->ops->nvmaxnormlocal     = N_VMaxNorm_Serial;
  v->ops->nvminlocal         = N_VMin_Serial;
  v->ops->nvl1normlocal      = N_VL1Norm_Serial;
  v->ops->nvinvtestlocal     = N_VInvTest_Serial;
  v->ops->nvconstrmasklocal  = N_VConstrMask_Serial;
  v->ops->nvminquotientlocal = N_VMinQuotient_Serial;
  v->ops->nvwsqrsumlocal     = N_VWSqrSumLocal_Serial;
  v->ops->nvwsqrsummasklocal = N_VWSqrSumMaskLocal_Serial;

  /* single buffer reduction operations */
  v->ops->nvdotprodmultilocal = N_VDotProdMulti_Serial;

  /* XBraid interface operations */
  v->ops->nvbufsize   = N_VBufSize_Serial;
  v->ops->nvbufpack   = N_VBufPack_Serial;
  v->ops->nvbufunpack = N_VBufUnpack_Serial;

  /* debugging functions */
  v->ops->nvprint     = N_VPrint_Serial;
  v->ops->nvprintfile = N_VPrintFile_Serial;

  /* Create content */
  content = NULL;
  content = (N_VectorContent_Serial)malloc(sizeof *content);
  SUNAssertNull(content, SUN_ERR_MALLOC_FAIL);

  /* Attach content */
  v->content = content;

  /* Initialize content */
  content->length   = length;
  content->own_data = SUNFALSE;
  content->data     = NULL;

  return (v);
}